

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

void pierce_outer_wall(chunk_conflict *c,loc grid)

{
  wchar_t wVar1;
  loc_conflict *plVar2;
  loc_conflict grid_00;
  loc grid_01;
  loc grid_02;
  _Bool _Var3;
  wchar_t local_20;
  wchar_t wStack_1c;
  loc adj;
  chunk_conflict *c_local;
  loc grid_local;
  
  if (dun->wall_n < (int)(uint)z_info->wall_pierce_max) {
    plVar2 = dun->wall;
    wVar1 = dun->wall_n;
    plVar2[wVar1].x = grid.x;
    plVar2[wVar1].y = grid.y;
    dun->wall_n = dun->wall_n + L'\x01';
  }
  c_local._4_4_ = grid.y;
  for (wStack_1c = c_local._4_4_ + L'\xffffffff'; wStack_1c <= c_local._4_4_ + L'\x01';
      wStack_1c = wStack_1c + L'\x01') {
    c_local._0_4_ = grid.x;
    for (local_20 = (int)c_local + L'\xffffffff'; local_20 <= (int)c_local + L'\x01';
        local_20 = local_20 + L'\x01') {
      if ((((local_20 != L'\0') && (wStack_1c != L'\0')) &&
          (grid_00.y = wStack_1c, grid_00.x = local_20, _Var3 = square_in_bounds((chunk *)c,grid_00)
          , _Var3)) &&
         (grid_01.y = wStack_1c, grid_01.x = local_20,
         _Var3 = square_is_granite_with_flag(c,grid_01,L'\f'), _Var3)) {
        grid_02.y = wStack_1c;
        grid_02.x = local_20;
        set_marked_granite(c,grid_02,L'\r');
      }
    }
  }
  return;
}

Assistant:

static void pierce_outer_wall(struct chunk *c, struct loc grid)
{
	struct loc adj;

	/* Save the wall location */
	if (dun->wall_n < z_info->wall_pierce_max) {
		dun->wall[dun->wall_n] = grid;
		dun->wall_n++;
	}

	/* Forbid re-entry near this piercing */
	for (adj.y = grid.y - 1; adj.y <= grid.y + 1; adj.y++) {
		for (adj.x = grid.x - 1; adj.x <= grid.x + 1; adj.x++) {
			if (adj.x != 0 && adj.y != 0 &&
					square_in_bounds(c, adj) &&
					square_is_granite_with_flag(c, adj,
					SQUARE_WALL_OUTER)) {
				set_marked_granite(c, adj, SQUARE_WALL_SOLID);
			}
		}
	}
}